

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderClose(xmlTextReaderPtr reader)

{
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else {
    reader->node = (xmlNodePtr)0x0;
    reader->curnode = (xmlNodePtr)0x0;
    reader->mode = 4;
    if (reader->faketext != (xmlNodePtr)0x0) {
      xmlFreeNode(reader->faketext);
      reader->faketext = (xmlNodePtr)0x0;
    }
    if (reader->ctxt != (xmlParserCtxtPtr)0x0) {
      if (((reader->ctxt->vctxt).vstateTab != (xmlValidState *)0x0) &&
         (0 < (reader->ctxt->vctxt).vstateMax)) {
        while (0 < (reader->ctxt->vctxt).vstateNr) {
          xmlValidatePopElement(&reader->ctxt->vctxt,(xmlDocPtr)0x0,(xmlNodePtr)0x0,(xmlChar *)0x0);
        }
        (*xmlFree)((reader->ctxt->vctxt).vstateTab);
        (reader->ctxt->vctxt).vstateTab = (xmlValidState *)0x0;
        (reader->ctxt->vctxt).vstateMax = 0;
      }
      xmlStopParser(reader->ctxt);
      if (reader->ctxt->myDoc != (xmlDocPtr)0x0) {
        if (reader->preserve == 0) {
          xmlTextReaderFreeDoc(reader,reader->ctxt->myDoc);
        }
        reader->ctxt->myDoc = (xmlDocPtr)0x0;
      }
    }
    if ((reader->input != (xmlParserInputBufferPtr)0x0) && ((reader->allocs & 1U) != 0)) {
      xmlFreeParserInputBuffer(reader->input);
      reader->allocs = reader->allocs + -1;
    }
    reader_local._4_4_ = 0;
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderClose(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(-1);
    reader->node = NULL;
    reader->curnode = NULL;
    reader->mode = XML_TEXTREADER_MODE_CLOSED;
    if (reader->faketext != NULL) {
        xmlFreeNode(reader->faketext);
        reader->faketext = NULL;
    }
    if (reader->ctxt != NULL) {
#ifdef LIBXML_VALID_ENABLED
	if ((reader->ctxt->vctxt.vstateTab != NULL) &&
	    (reader->ctxt->vctxt.vstateMax > 0)){
#ifdef LIBXML_REGEXP_ENABLED
            while (reader->ctxt->vctxt.vstateNr > 0)
                xmlValidatePopElement(&reader->ctxt->vctxt, NULL, NULL, NULL);
#endif /* LIBXML_REGEXP_ENABLED */
	    xmlFree(reader->ctxt->vctxt.vstateTab);
	    reader->ctxt->vctxt.vstateTab = NULL;
	    reader->ctxt->vctxt.vstateMax = 0;
	}
#endif /* LIBXML_VALID_ENABLED */
	xmlStopParser(reader->ctxt);
	if (reader->ctxt->myDoc != NULL) {
	    if (reader->preserve == 0)
		xmlTextReaderFreeDoc(reader, reader->ctxt->myDoc);
	    reader->ctxt->myDoc = NULL;
	}
    }
    if ((reader->input != NULL)  && (reader->allocs & XML_TEXTREADER_INPUT)) {
	xmlFreeParserInputBuffer(reader->input);
	reader->allocs -= XML_TEXTREADER_INPUT;
    }
    return(0);
}